

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

Float pbrt::MISWeight(Integrator *integrator,Vertex *lightVertices,Vertex *cameraVertices,
                     Vertex *sampled,int s,int t,LightSamplerHandle *lightSampler)

{
  int iVar1;
  byte bVar2;
  float *target;
  long in_RDX;
  long in_RSI;
  int in_R8D;
  int in_R9D;
  Float FVar3;
  Float FVar4;
  bool deltaLightvertex;
  int i_1;
  int i;
  Float ri;
  ScopedAssignment<float> a7;
  ScopedAssignment<float> a6;
  ScopedAssignment<float> a5;
  ScopedAssignment<float> a4;
  ScopedAssignment<bool> a3;
  ScopedAssignment<bool> a2;
  ScopedAssignment<pbrt::Vertex> a1;
  Vertex *ptMinus;
  Vertex *qsMinus;
  Vertex *pt;
  Vertex *qs;
  anon_class_1_0_00000001 remap0;
  Float sumRi;
  undefined6 in_stack_fffffffffffff5b8;
  undefined1 in_stack_fffffffffffff5be;
  undefined1 in_stack_fffffffffffff5bf;
  Float in_stack_fffffffffffff5c0;
  Float in_stack_fffffffffffff5c4;
  undefined4 in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5cc;
  ScopedAssignment<pbrt::Vertex> *in_stack_fffffffffffff5d0;
  float local_a10;
  float local_9e0;
  long local_9c0;
  long local_9b8;
  long local_9b0;
  long local_9a8;
  int local_994;
  int local_990;
  float local_98c;
  ScopedAssignment<float> local_988;
  ScopedAssignment<float> local_978;
  ScopedAssignment<float> local_968;
  ScopedAssignment<float> local_958;
  Vertex *in_stack_fffffffffffff6c0;
  Integrator *in_stack_fffffffffffff6c8;
  Vertex *in_stack_fffffffffffff6d0;
  ScopedAssignment<float> local_920;
  ScopedAssignment<float> local_910;
  LightSamplerHandle *in_stack_fffffffffffff700;
  Vertex *in_stack_fffffffffffff708;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffff710;
  Vertex *in_stack_fffffffffffff718;
  ScopedAssignment<bool> local_8e0;
  ScopedAssignment<bool> local_8d0 [4];
  Vertex *in_stack_fffffffffffff770;
  Vertex *in_stack_fffffffffffff778;
  Integrator *in_stack_fffffffffffff780;
  Vertex *in_stack_fffffffffffff788;
  anon_class_1_0_00000001 local_35;
  float local_34;
  int local_30;
  int local_2c;
  long local_20;
  long local_18;
  float local_4;
  
  if (in_R8D + in_R9D == 2) {
    local_4 = 1.0;
  }
  else {
    local_34 = 0.0;
    if (in_R8D < 1) {
      local_9a8 = 0;
    }
    else {
      local_9a8 = in_RSI + (long)(in_R8D + -1) * 0x160;
    }
    if (in_R9D < 1) {
      local_9b0 = 0;
    }
    else {
      local_9b0 = in_RDX + (long)(in_R9D + -1) * 0x160;
    }
    if (in_R8D < 2) {
      local_9b8 = 0;
    }
    else {
      local_9b8 = in_RSI + (long)(in_R8D + -2) * 0x160;
    }
    if (in_R9D < 2) {
      local_9c0 = 0;
    }
    else {
      local_9c0 = in_RDX + (long)(in_R9D + -2) * 0x160;
    }
    local_30 = in_R9D;
    local_2c = in_R8D;
    local_20 = in_RDX;
    local_18 = in_RSI;
    Vertex::Vertex((Vertex *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
    ScopedAssignment<pbrt::Vertex>::ScopedAssignment
              (in_stack_fffffffffffff5d0,
               (Vertex *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (Vertex *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
    if (local_2c == 1) {
      Vertex::Vertex((Vertex *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                     (Vertex *)
                     CONCAT17(in_stack_fffffffffffff5bf,
                              CONCAT16(in_stack_fffffffffffff5be,in_stack_fffffffffffff5b8)));
      ScopedAssignment<pbrt::Vertex>::ScopedAssignment
                (in_stack_fffffffffffff5d0,
                 (Vertex *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                 (Vertex *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
      ScopedAssignment<pbrt::Vertex>::operator=
                ((ScopedAssignment<pbrt::Vertex> *)
                 CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                 (ScopedAssignment<pbrt::Vertex> *)
                 CONCAT17(in_stack_fffffffffffff5bf,
                          CONCAT16(in_stack_fffffffffffff5be,in_stack_fffffffffffff5b8)));
      ScopedAssignment<pbrt::Vertex>::~ScopedAssignment
                ((ScopedAssignment<pbrt::Vertex> *)
                 CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
    }
    else if (local_30 == 1) {
      Vertex::Vertex((Vertex *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                     (Vertex *)
                     CONCAT17(in_stack_fffffffffffff5bf,
                              CONCAT16(in_stack_fffffffffffff5be,in_stack_fffffffffffff5b8)));
      ScopedAssignment<pbrt::Vertex>::ScopedAssignment
                (in_stack_fffffffffffff5d0,
                 (Vertex *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                 (Vertex *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
      ScopedAssignment<pbrt::Vertex>::operator=
                ((ScopedAssignment<pbrt::Vertex> *)
                 CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                 (ScopedAssignment<pbrt::Vertex> *)
                 CONCAT17(in_stack_fffffffffffff5bf,
                          CONCAT16(in_stack_fffffffffffff5be,in_stack_fffffffffffff5b8)));
      ScopedAssignment<pbrt::Vertex>::~ScopedAssignment
                ((ScopedAssignment<pbrt::Vertex> *)
                 CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
    }
    ScopedAssignment<bool>::ScopedAssignment(local_8d0,(bool *)0x0,false);
    ScopedAssignment<bool>::ScopedAssignment(&local_8e0,(bool *)0x0,false);
    if (local_9b0 != 0) {
      ScopedAssignment<bool>::ScopedAssignment
                ((ScopedAssignment<bool> *)&stack0xfffffffffffff710,(bool *)(local_9b0 + 0x150),
                 false);
      ScopedAssignment<bool>::operator=
                (local_8d0,(ScopedAssignment<bool> *)&stack0xfffffffffffff710);
      ScopedAssignment<bool>::~ScopedAssignment((ScopedAssignment<bool> *)&stack0xfffffffffffff710);
    }
    if (local_9a8 != 0) {
      ScopedAssignment<bool>::ScopedAssignment
                ((ScopedAssignment<bool> *)&stack0xfffffffffffff700,(bool *)(local_9a8 + 0x150),
                 false);
      ScopedAssignment<bool>::operator=
                (&local_8e0,(ScopedAssignment<bool> *)&stack0xfffffffffffff700);
      ScopedAssignment<bool>::~ScopedAssignment((ScopedAssignment<bool> *)&stack0xfffffffffffff700);
    }
    ScopedAssignment<float>::ScopedAssignment(&local_910,(float *)0x0,0.0);
    if (local_9b0 != 0) {
      if (local_2c < 1) {
        LightSamplerHandle::LightSamplerHandle
                  ((LightSamplerHandle *)
                   CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                   (LightSamplerHandle *)
                   CONCAT17(in_stack_fffffffffffff5bf,
                            CONCAT16(in_stack_fffffffffffff5be,in_stack_fffffffffffff5b8)));
        local_9e0 = Vertex::PdfLightOrigin
                              (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
                               in_stack_fffffffffffff708,in_stack_fffffffffffff700);
      }
      else {
        local_9e0 = Vertex::PDF(in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                                in_stack_fffffffffffff778,in_stack_fffffffffffff770);
      }
      ScopedAssignment<float>::ScopedAssignment(&local_920,(float *)(local_9b0 + 0x158),local_9e0);
      ScopedAssignment<float>::operator=(&local_910,&local_920);
      ScopedAssignment<float>::~ScopedAssignment(&local_920);
    }
    ScopedAssignment<float>::ScopedAssignment
              ((ScopedAssignment<float> *)&stack0xfffffffffffff6c8,(float *)0x0,0.0);
    if (local_9c0 != 0) {
      if (local_2c < 1) {
        local_a10 = Vertex::PdfLight(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
                                     in_stack_fffffffffffff6c0);
      }
      else {
        local_a10 = Vertex::PDF(in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                                in_stack_fffffffffffff778,in_stack_fffffffffffff770);
      }
      ScopedAssignment<float>::ScopedAssignment
                ((ScopedAssignment<float> *)&stack0xfffffffffffff6b8,(float *)(local_9c0 + 0x158),
                 local_a10);
      ScopedAssignment<float>::operator=
                ((ScopedAssignment<float> *)&stack0xfffffffffffff6c8,
                 (ScopedAssignment<float> *)&stack0xfffffffffffff6b8);
      ScopedAssignment<float>::~ScopedAssignment
                ((ScopedAssignment<float> *)&stack0xfffffffffffff6b8);
    }
    ScopedAssignment<float>::ScopedAssignment(&local_958,(float *)0x0,0.0);
    if (local_9a8 != 0) {
      FVar3 = Vertex::PDF(in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                          in_stack_fffffffffffff778,in_stack_fffffffffffff770);
      ScopedAssignment<float>::ScopedAssignment(&local_968,(float *)(local_9a8 + 0x158),FVar3);
      ScopedAssignment<float>::operator=(&local_958,&local_968);
      ScopedAssignment<float>::~ScopedAssignment(&local_968);
    }
    ScopedAssignment<float>::ScopedAssignment(&local_978,(float *)0x0,0.0);
    if (local_9b8 != 0) {
      target = (float *)(local_9b8 + 0x158);
      FVar3 = Vertex::PDF(in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                          in_stack_fffffffffffff778,in_stack_fffffffffffff770);
      ScopedAssignment<float>::ScopedAssignment(&local_988,target,FVar3);
      ScopedAssignment<float>::operator=(&local_978,&local_988);
      ScopedAssignment<float>::~ScopedAssignment(&local_988);
    }
    local_98c = 1.0;
    while (iVar1 = local_30, local_990 = iVar1 + -1, 0 < local_990) {
      FVar3 = MISWeight::anon_class_1_0_00000001::operator()
                        (&local_35,*(float *)(local_20 + 0x158 + (long)local_990 * 0x160));
      FVar4 = MISWeight::anon_class_1_0_00000001::operator()
                        (&local_35,*(float *)(local_20 + 0x154 + (long)local_990 * 0x160));
      local_98c = (FVar3 / FVar4) * local_98c;
      local_30 = local_990;
      if (((*(byte *)(local_20 + (long)local_990 * 0x160 + 0x150) & 1) == 0) &&
         (local_30 = local_990, (*(byte *)(local_20 + (long)(iVar1 + -2) * 0x160 + 0x150) & 1) == 0)
         ) {
        local_34 = local_98c + local_34;
        local_30 = local_990;
      }
    }
    local_98c = 1.0;
    iVar1 = local_2c;
    while (local_994 = iVar1 + -1, -1 < local_994) {
      in_stack_fffffffffffff5c4 =
           MISWeight::anon_class_1_0_00000001::operator()
                     (&local_35,*(float *)(local_18 + 0x158 + (long)local_994 * 0x160));
      in_stack_fffffffffffff5c0 =
           MISWeight::anon_class_1_0_00000001::operator()
                     (&local_35,*(float *)(local_18 + 0x154 + (long)local_994 * 0x160));
      local_98c = (in_stack_fffffffffffff5c4 / in_stack_fffffffffffff5c0) * local_98c;
      if (local_994 < 1) {
        bVar2 = Vertex::IsDeltaLight
                          ((Vertex *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
      }
      else {
        bVar2 = *(byte *)(local_18 + (long)(iVar1 + -2) * 0x160 + 0x150);
      }
      iVar1 = local_994;
      if (((*(byte *)(local_18 + (long)local_994 * 0x160 + 0x150) & 1) == 0) && ((bVar2 & 1) == 0))
      {
        local_34 = local_98c + local_34;
      }
    }
    local_4 = 1.0 / (local_34 + 1.0);
    ScopedAssignment<float>::~ScopedAssignment(&local_978);
    ScopedAssignment<float>::~ScopedAssignment(&local_958);
    ScopedAssignment<float>::~ScopedAssignment((ScopedAssignment<float> *)&stack0xfffffffffffff6c8);
    ScopedAssignment<float>::~ScopedAssignment(&local_910);
    ScopedAssignment<bool>::~ScopedAssignment(&local_8e0);
    ScopedAssignment<bool>::~ScopedAssignment(local_8d0);
    ScopedAssignment<pbrt::Vertex>::~ScopedAssignment
              ((ScopedAssignment<pbrt::Vertex> *)
               CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
  }
  return local_4;
}

Assistant:

Float MISWeight(const Integrator &integrator, Vertex *lightVertices,
                Vertex *cameraVertices, Vertex &sampled, int s, int t,
                LightSamplerHandle lightSampler) {
    if (s + t == 2)
        return 1;
    Float sumRi = 0;
    // Define helper function _remap0_ that deals with Dirac delta functions
    auto remap0 = [](float f) -> Float { return f != 0 ? f : 1; };

    // Temporarily update vertex properties for current strategy
    // Look up connection vertices and their predecessors
    Vertex *qs = s > 0 ? &lightVertices[s - 1] : nullptr,
           *pt = t > 0 ? &cameraVertices[t - 1] : nullptr,
           *qsMinus = s > 1 ? &lightVertices[s - 2] : nullptr,
           *ptMinus = t > 1 ? &cameraVertices[t - 2] : nullptr;

    // Update sampled vertex for $s=1$ or $t=1$ strategy
    ScopedAssignment<Vertex> a1;
    if (s == 1)
        a1 = {qs, sampled};
    else if (t == 1)
        a1 = {pt, sampled};

    // Mark connection vertices as non-degenerate
    ScopedAssignment<bool> a2, a3;
    if (pt)
        a2 = {&pt->delta, false};
    if (qs)
        a3 = {&qs->delta, false};

    // Update reverse density of vertex $\pt{}_{t-1}$
    ScopedAssignment<Float> a4;
    if (pt)
        a4 = {&pt->pdfRev, s > 0 ? qs->PDF(integrator, qsMinus, *pt)
                                 : pt->PdfLightOrigin(integrator.infiniteLights, *ptMinus,
                                                      lightSampler)};

    // Update reverse density of vertex $\pt{}_{t-2}$
    ScopedAssignment<Float> a5;
    if (ptMinus)
        a5 = {&ptMinus->pdfRev, s > 0 ? pt->PDF(integrator, qs, *ptMinus)
                                      : pt->PdfLight(integrator, *ptMinus)};

    // Update reverse density of vertices $\pq{}_{s-1}$ and $\pq{}_{s-2}$
    ScopedAssignment<Float> a6;
    if (qs)
        a6 = {&qs->pdfRev, pt->PDF(integrator, ptMinus, *qs)};
    ScopedAssignment<Float> a7;
    if (qsMinus)
        a7 = {&qsMinus->pdfRev, qs->PDF(integrator, pt, *qsMinus)};

    // Consider hypothetical connection strategies along the camera subpath
    Float ri = 1;
    for (int i = t - 1; i > 0; --i) {
        ri *= remap0(cameraVertices[i].pdfRev) / remap0(cameraVertices[i].pdfFwd);
        if (!cameraVertices[i].delta && !cameraVertices[i - 1].delta)
            sumRi += ri;
    }

    // Consider hypothetical connection strategies along the light subpath
    ri = 1;
    for (int i = s - 1; i >= 0; --i) {
        ri *= remap0(lightVertices[i].pdfRev) / remap0(lightVertices[i].pdfFwd);
        bool deltaLightvertex =
            i > 0 ? lightVertices[i - 1].delta : lightVertices[0].IsDeltaLight();
        if (!lightVertices[i].delta && !deltaLightvertex)
            sumRi += ri;
    }

    return 1 / (1 + sumRi);
}